

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWriter.cpp
# Opt level: O2

void __thiscall
MILBlob::Blob::FileWriter::ReadData
          (FileWriter *this,uint64_t offset,Span<unsigned_char,_18446744073709551615UL> destData)

{
  runtime_error *this_00;
  
  std::istream::seekg((long)this,(_Ios_Seekdir)offset);
  std::istream::read((char *)this,(long)destData.m_ptr);
  if (*(int *)(&this->field_0x20 + *(long *)(*(long *)this + -0x18)) == 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"[MIL FileWriter]: Unknown error occurred while reading data from the file.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void FileWriter::ReadData(uint64_t offset, Util::Span<uint8_t> destData)
{
    m_fileStream.seekg(static_cast<std::streamsize>(offset), std::ios::beg);
    m_fileStream.read(reinterpret_cast<char*>(destData.Data()), static_cast<std::streamsize>(destData.Size()));
    MILVerifyIsTrue(m_fileStream.good(),
                    std::runtime_error,
                    "[MIL FileWriter]: Unknown error occurred while reading data from the file.");
}